

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O3

void __thiscall fmcalc::init_programme(fmcalc *this,int maxRunLevel)

{
  vector<int,_std::allocator<int>_> *this_00;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *this_01;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_02;
  vector<int,std::allocator<int>> *this_03;
  iterator __position;
  int iVar1;
  long *plVar2;
  FILE *__stream;
  size_t sVar3;
  pointer piVar4;
  long lVar5;
  pointer pvVar6;
  undefined8 extraout_RAX;
  long *plVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  pointer pvVar11;
  fm_programme f;
  string file;
  undefined8 local_98;
  long local_90;
  long local_88;
  long lStack_80;
  vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
  *local_78;
  _Alloc_hider local_70;
  value_type_conflict1 local_50;
  int iStack_4c;
  
  local_70._M_p = &stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffff90,"input/fm_programme.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffffb0,(ulong)&stack0xffffffffffffff90);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)&stack0xffffffffffffffb0,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar7 = plVar2 + 2;
    if ((long *)*plVar2 == plVar7) {
      local_88 = *plVar7;
      lStack_80 = plVar2[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar7;
      local_98 = (long *)*plVar2;
    }
    local_90 = plVar2[1];
    *plVar2 = (long)plVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)&stack0xffffffffffffff90,(string *)&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if ((undefined1 *)CONCAT44(iStack_4c,local_50) != &stack0xffffffffffffffc0) {
      operator_delete((undefined1 *)CONCAT44(iStack_4c,local_50));
    }
  }
  __stream = fopen(local_70._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    init_programme((fmcalc *)&stack0xffffffffffffff90);
    if (local_70._M_p != &stack0xffffffffffffffa0) {
      operator_delete(local_70._M_p);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (maxRunLevel != -1) {
    this->maxRunLevel_ = maxRunLevel;
  }
  this_00 = &this->level_to_maxagg_id_;
  if ((this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->level_to_maxagg_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_50 = -1;
    std::vector<int,_std::allocator<int>_>::resize(this_00,1,&stack0xffffffffffffffb0);
  }
  sVar3 = fread(&local_98,0xc,1,__stream);
  if (sVar3 != 0) {
    this_01 = &this->pfm_vec_vec_;
    this_02 = &this->node_to_direct_sub_nodes_vec_;
    local_78 = &this->node_to_coverage_ids_;
    do {
      if (local_98._4_4_ <= this->maxRunLevel_) {
        if (this->maxLevel_ < local_98._4_4_) {
          this->maxLevel_ = local_98._4_4_;
          local_50 = -1;
          std::vector<int,_std::allocator<int>_>::resize
                    (this_00,(long)local_98._4_4_ + 1,&stack0xffffffffffffffb0);
        }
        piVar10 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        iVar1 = local_98._4_4_;
        if (local_98._4_4_ == 1) {
          if (*piVar10 < (int)local_98) {
            *piVar10 = (int)local_98;
          }
          pvVar11 = (this->pfm_vec_vec_).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->pfm_vec_vec_).
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish == pvVar11) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::resize(this_01,1);
            pvVar11 = (this_01->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          piVar4 = (pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = (long)(int)local_98;
          if ((ulong)((long)(pvVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar4 >> 2) < lVar9 + 1U) {
            std::vector<int,_std::allocator<int>_>::resize(pvVar11,lVar9 + 1U);
            piVar4 = (((this_01->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start;
            lVar9 = (long)(int)local_98;
          }
          piVar4[lVar9] = (int)local_98;
          piVar10 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          iVar1 = local_98._4_4_;
        }
        lVar9 = (long)iVar1;
        if (piVar10[lVar9] < (int)local_90) {
          piVar10[lVar9] = (int)local_90;
          lVar9 = (long)local_98._4_4_;
          iVar1 = local_98._4_4_;
        }
        pvVar11 = (this->pfm_vec_vec_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(this->pfm_vec_vec_).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar11 >> 3) *
                   -0x5555555555555555) < lVar9 + 1U) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(this_01,(long)(iVar1 + 1));
          lVar9 = (long)local_98._4_4_;
          pvVar11 = (this_01->
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        }
        lVar8 = *(long *)&pvVar11[lVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
        lVar5 = (long)(int)local_98;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar11[lVar9].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data + 8) - lVar8 >> 2) < lVar5 + 1U)
        {
          std::vector<int,_std::allocator<int>_>::resize(pvVar11 + lVar9,(long)((int)local_98 + 1));
          lVar5 = (long)(int)local_98;
          lVar8 = *(long *)&(this_01->
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[local_98._4_4_].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data;
        }
        *(int *)(lVar8 + lVar5 * 4) = (int)local_90;
        if ((int)local_90 == 0) {
          init_programme();
        }
        pvVar6 = (this->node_to_direct_sub_nodes_vec_).
                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = (long)local_98._4_4_;
        if ((ulong)(((long)(this->node_to_direct_sub_nodes_vec_).
                           super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6 >> 3) *
                   -0x5555555555555555) < lVar9 + 1U) {
          std::
          vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          ::resize(this_02,(long)(local_98._4_4_ + 1));
          std::
          vector<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
          ::resize(local_78,(long)local_98._4_4_ + 1);
          lVar9 = (long)local_98._4_4_;
          pvVar6 = (this_02->
                   super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        }
        lVar8 = *(long *)&pvVar6[lVar9].
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar5 = (long)(int)local_90;
        if ((ulong)(((long)*(pointer *)
                            ((long)&pvVar6[lVar9].
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + 8) - lVar8 >> 3) *
                   -0x5555555555555555) < lVar5 + 1U) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(pvVar6 + lVar9,(long)((int)local_90 + 1));
          std::
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ::resize((local_78->
                   super__Vector_base<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_98._4_4_,
                   (long)(int)local_90 + 1);
          lVar5 = (long)(int)local_90;
          lVar8 = *(long *)&(this_02->
                            super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[local_98._4_4_].
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data;
        }
        this_03 = (vector<int,std::allocator<int>> *)(lVar8 + lVar5 * 0x18);
        __position._M_current = *(int **)(this_03 + 8);
        if (__position._M_current == *(int **)(this_03 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_03,__position,(int *)&local_98);
        }
        else {
          *__position._M_current = (int)local_98;
          *(int **)(this_03 + 8) = __position._M_current + 1;
        }
      }
      sVar3 = fread(&local_98,0xc,1,__stream);
    } while (sVar3 != 0);
  }
  fclose(__stream);
  if (local_70._M_p != &stack0xffffffffffffffa0) {
    operator_delete(local_70._M_p);
  }
  return;
}

Assistant:

void fmcalc::init_programme(int maxRunLevel)
{

	FILE *fin = NULL;
	std::string file = FMPROGRAMME_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL){
		fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	fm_programme f;
    if (maxRunLevel != -1) maxRunLevel_ = maxRunLevel;

	if (level_to_maxagg_id_.size() == 0) {
		level_to_maxagg_id_.resize(1, -1);
	}
	size_t i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {
        if (f.level_id <= maxRunLevel_){
			if (maxLevel_ < f.level_id) {
				maxLevel_ = f.level_id;
				level_to_maxagg_id_.resize(maxLevel_ + 1, -1);
			}
			if (f.level_id == 1) {	
				if (f.from_agg_id > level_to_maxagg_id_[0])level_to_maxagg_id_[0] = f.from_agg_id;
				if (pfm_vec_vec_.size() < 1) {
					pfm_vec_vec_.resize(1);
				}
				if (pfm_vec_vec_[0].size() < (size_t)f.from_agg_id + 1) {
					pfm_vec_vec_[0].resize(f.from_agg_id + 1);
				}
				pfm_vec_vec_[0][f.from_agg_id] = f.from_agg_id;
			}					
			if (f.to_agg_id > level_to_maxagg_id_[f.level_id])level_to_maxagg_id_[f.level_id] = f.to_agg_id;
            if (pfm_vec_vec_.size() < (size_t)f.level_id + 1) {
                pfm_vec_vec_.resize(f.level_id + 1);
            }
            if (pfm_vec_vec_[f.level_id].size() < (size_t)f.from_agg_id + 1) {
                pfm_vec_vec_[f.level_id].resize(f.from_agg_id + 1);
            }
            pfm_vec_vec_[f.level_id][f.from_agg_id] = f.to_agg_id;
            if (f.to_agg_id == 0) {
                fprintf(stderr, "FATAL: Invalid agg id from fm_programme.bin\n");
            }

	    // Fill node_to_direct_sub_nodes_vec_[level_id][to_agg_id] = vector<int>(from_agg_id)
	    if (node_to_direct_sub_nodes_vec_.size() < (size_t)f.level_id + 1) {
		node_to_direct_sub_nodes_vec_.resize(f.level_id + 1);
		node_to_coverage_ids_.resize(f.level_id + 1);
	    }
	    if (node_to_direct_sub_nodes_vec_[f.level_id].size() < (size_t)f.to_agg_id + 1) {
		node_to_direct_sub_nodes_vec_[f.level_id].resize(f.to_agg_id + 1);
		node_to_coverage_ids_[f.level_id].resize(f.to_agg_id + 1);
	    }
	    node_to_direct_sub_nodes_vec_[f.level_id][f.to_agg_id].push_back(f.from_agg_id);
        }
		i = fread(&f, sizeof(f), 1, fin);
	}
	fclose(fin);

}